

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2Comment(void *ctx,xmlChar *value)

{
  xmlNodePtr cur;
  xmlNodePtr elem;
  xmlNodePtr parent;
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *value_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    cur = *(xmlNodePtr *)((long)ctx + 0x50);
    elem = xmlNewDocComment(*(xmlDocPtr *)((long)ctx + 0x10),value);
    if (elem != (xmlNodePtr)0x0) {
      if ((*(int *)((long)ctx + 0x1b4) != 0) && (*(long *)((long)ctx + 0x38) != 0)) {
        if (*(int *)(*(long *)((long)ctx + 0x38) + 0x34) < 0xffff) {
          elem->line = (unsigned_short)*(undefined4 *)(*(long *)((long)ctx + 0x38) + 0x34);
        }
        else {
          elem->line = 0xffff;
        }
      }
      if (*(int *)((long)ctx + 0x150) == 1) {
        xmlAddChild(*(xmlNodePtr *)(*(long *)((long)ctx + 0x10) + 0x50),elem);
      }
      else if (*(int *)((long)ctx + 0x150) == 2) {
        xmlAddChild(*(xmlNodePtr *)(*(long *)((long)ctx + 0x10) + 0x58),elem);
      }
      else if (cur == (xmlNodePtr)0x0) {
        xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x10),elem);
      }
      else if (cur->type == XML_ELEMENT_NODE) {
        xmlAddChild(cur,elem);
      }
      else {
        xmlAddSibling(cur,elem);
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2Comment(void *ctx, const xmlChar *value)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;

    if (ctx == NULL) return;
    parent = ctxt->node;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext, "SAX.xmlSAX2Comment(%s)\n", value);
#endif
    ret = xmlNewDocComment(ctxt->myDoc, value);
    if (ret == NULL) return;
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if (ctxt->input->line < 65535)
		ret->line = (short) ctxt->input->line;
	    else
	        ret->line = 65535;
	}
    }

    if (ctxt->inSubset == 1) {
	xmlAddChild((xmlNodePtr) ctxt->myDoc->intSubset, ret);
	return;
    } else if (ctxt->inSubset == 2) {
	xmlAddChild((xmlNodePtr) ctxt->myDoc->extSubset, ret);
	return;
    }
    if (parent == NULL) {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "Setting xmlSAX2Comment as root\n");
#endif
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
	return;
    }
    if (parent->type == XML_ELEMENT_NODE) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext,
		"adding xmlSAX2Comment child to %s\n", parent->name);
#endif
	xmlAddChild(parent, ret);
    } else {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext,
		"adding xmlSAX2Comment sibling to ");
	xmlDebugDumpOneNode(stderr, parent, 0);
#endif
	xmlAddSibling(parent, ret);
    }
}